

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O1

void listelem_add_block(listelem_alloc_t *list,char *caller_file,int caller_line)

{
  ulong uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char **ptr;
  glist_t pgVar5;
  long lVar6;
  int val;
  char **ppcVar7;
  
  if (list->blocksize == (glist_t)0x0) {
    val = 0x32;
  }
  else {
    val = *(int *)&list->blocksize->data;
  }
  if (list->blk_alloc == 0) {
    val = val * 2;
    uVar1 = list->elemsize;
    if (0x40000 < (long)val * uVar1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      val = SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x40000)) / auVar3,0);
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1 * (long)val;
    list->blk_alloc = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000)) / auVar4,0);
  }
  ptr = (char **)__ckd_calloc__((long)val,list->elemsize,caller_file,caller_line);
  list->freelist = ptr;
  pgVar5 = glist_add_ptr(list->blocks,ptr);
  list->blocks = pgVar5;
  pgVar5 = glist_add_int32(list->blocksize,val);
  list->blocksize = pgVar5;
  if (val + -1 != 0) {
    lVar6 = (long)(val + -1);
    sVar2 = list->elemsize;
    ppcVar7 = ptr;
    do {
      ptr = (char **)((long)ppcVar7 + sVar2);
      *ppcVar7 = (char *)ptr;
      lVar6 = lVar6 + -1;
      ppcVar7 = ptr;
    } while (lVar6 != 0);
  }
  *ptr = (char *)0x0;
  list->blk_alloc = list->blk_alloc - 1;
  list->n_blocks = list->n_blocks + 1;
  return;
}

Assistant:

static void
listelem_add_block(listelem_alloc_t *list, char *caller_file, int caller_line)
{
    char **cpp, *cp;
    size_t j;
    int32 blocksize;

    blocksize = list->blocksize ? gnode_int32(list->blocksize) : MIN_ALLOC;
    /* Check if block size should be increased (if many requests for this size) */
    if (list->blk_alloc == 0) {
        /* See above.  No sense in allocating blocks bigger than
         * 256KiB (well, actually, there might be, but we'll worry
         * about that later). */
	blocksize <<= 1;
        if (blocksize * list->elemsize > (1 << 18))
            blocksize = (1 << 18) / list->elemsize;
	list->blk_alloc = (1 << 18) / (blocksize * list->elemsize);
    }

    /* Allocate block */
    cpp = list->freelist =
	(char **) __ckd_calloc__(blocksize, list->elemsize,
				 caller_file, caller_line);
    list->blocks = glist_add_ptr(list->blocks, cpp);
    list->blocksize = glist_add_int32(list->blocksize, blocksize);
    cp = (char *) cpp;
    /* Link up the blocks via their first machine word. */
    for (j = blocksize - 1; j > 0; --j) {
	cp += list->elemsize;
	*cpp = cp;
	cpp = (char **) cp;
    }
    /* Make sure the last element's forward pointer is NULL */
    *cpp = NULL;
    --list->blk_alloc;
    ++list->n_blocks;
}